

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl)

{
  size_t sVar1;
  uint *puVar2;
  uint uVar3;
  mbedtls_cipher_mode_t mVar4;
  mbedtls_ssl_handshake_params *pmVar5;
  mbedtls_ssl_flight_item *pmVar6;
  mbedtls_cipher_info_t *pmVar7;
  size_t iv_len;
  uchar uVar8;
  int iVar9;
  mbedtls_ssl_flight_item *__ptr;
  uchar *puVar10;
  mbedtls_ssl_flight_item *pmVar11;
  ulong uVar12;
  mbedtls_ssl_transform *pmVar13;
  long lVar14;
  uchar uVar15;
  size_t sVar16;
  uint uVar17;
  long lVar18;
  mbedtls_ssl_flight_item **ppmVar19;
  size_t sVar20;
  bool bVar21;
  bool bVar22;
  size_t olen_1;
  size_t local_70;
  uchar mac [48];
  
  sVar20 = ssl->out_msglen;
  if (((((ssl->conf->field_0x174 & 2) == 0) ||
       (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) ||
      (ssl->handshake->retransmit_state != '\x01')) && (ssl->out_msgtype == 0x16)) {
    uVar8 = *ssl->out_msg;
    if ((uVar8 == '\0') || (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) {
      sVar1 = sVar20 - 4;
      ssl->out_msg[1] = (uchar)(sVar1 >> 0x10);
      ssl->out_msg[2] = (uchar)(sVar1 >> 8);
      ssl->out_msg[3] = (uchar)sVar1;
      if ((ssl->conf->field_0x174 & 2) != 0) {
        if (ssl->out_msglen - 0x3ff9 < 8) {
          return -0x7100;
        }
        memmove(ssl->out_msg + 0xc,ssl->out_msg + 4,sVar1);
        ssl->out_msglen = ssl->out_msglen + 8;
        if (uVar8 == '\0') {
          ssl->out_msg[4] = '\0';
          ssl->out_msg[5] = '\0';
        }
        else {
          ssl->out_msg[4] = *(uchar *)((long)&ssl->handshake->out_msg_seq + 1);
          ssl->out_msg[5] = (uchar)ssl->handshake->out_msg_seq;
          puVar2 = &ssl->handshake->out_msg_seq;
          *puVar2 = *puVar2 + 1;
        }
        sVar20 = sVar20 + 8;
        puVar10 = ssl->out_msg;
        puVar10[8] = '\0';
        puVar10[6] = '\0';
        puVar10[7] = '\0';
        puVar10 = ssl->out_msg;
        puVar10[0xb] = puVar10[3];
        *(undefined2 *)(puVar10 + 9) = *(undefined2 *)(puVar10 + 1);
      }
      if (uVar8 != '\0') {
        (*ssl->handshake->update_checksum)(ssl,ssl->out_msg,sVar20);
      }
      goto LAB_00112a97;
    }
LAB_00112d60:
    iVar9 = -0x6c00;
  }
  else {
LAB_00112a97:
    if ((((ssl->conf->field_0x174 & 2) != 0) &&
        (pmVar5 = ssl->handshake, pmVar5 != (mbedtls_ssl_handshake_params *)0x0)) &&
       ((pmVar5->retransmit_state != '\x01' && (uVar3 = ssl->out_msgtype, (uVar3 | 2) == 0x16)))) {
      __ptr = (mbedtls_ssl_flight_item *)calloc(1,0x20);
      if (__ptr == (mbedtls_ssl_flight_item *)0x0) {
        return -0x7f00;
      }
      local_70 = ssl->out_msglen;
      puVar10 = (uchar *)calloc(1,local_70);
      sVar1 = local_70;
      __ptr->p = puVar10;
      if (puVar10 == (uchar *)0x0) {
        free(__ptr);
        return -0x7f00;
      }
      memcpy(puVar10,ssl->out_msg,local_70);
      __ptr->len = sVar1;
      __ptr->type = (uchar)uVar3;
      pmVar6 = pmVar5->flight;
      if (pmVar5->flight == (mbedtls_ssl_flight_item *)0x0) {
        ppmVar19 = &pmVar5->flight;
      }
      else {
        do {
          pmVar11 = pmVar6;
          pmVar6 = pmVar11->next;
        } while (pmVar6 != (mbedtls_ssl_flight_item *)0x0);
        ppmVar19 = &pmVar11->next;
      }
      *ppmVar19 = __ptr;
    }
    *ssl->out_hdr = (uchar)ssl->out_msgtype;
    uVar3 = ssl->minor_ver;
    uVar8 = (uchar)ssl->major_ver;
    uVar17 = 1;
    if (uVar3 != 2) {
      uVar17 = uVar3;
    }
    bVar21 = (ssl->conf->field_0x174 & 2) == 0;
    uVar15 = '\x01' - uVar8;
    if (bVar21) {
      uVar15 = uVar8;
    }
    puVar10 = ssl->out_hdr;
    uVar17 = (uint)(byte)-(char)uVar17;
    if (bVar21) {
      uVar17 = uVar3;
    }
    puVar10[1] = uVar15;
    puVar10[2] = (uchar)uVar17;
    *ssl->out_len = (uchar)(sVar20 >> 8);
    ssl->out_len[1] = (uchar)sVar20;
    pmVar13 = ssl->transform_out;
    if (pmVar13 != (mbedtls_ssl_transform *)0x0) {
      if (ssl->session_out == (mbedtls_ssl_session *)0x0) goto LAB_00112d60;
      pmVar7 = (pmVar13->cipher_ctx_enc).cipher_info;
      uVar12 = ssl->out_msglen;
      if (pmVar7 == (mbedtls_cipher_info_t *)0x0) {
        if (uVar12 < 0x4001) {
          return -0x6c00;
        }
        return -0x7100;
      }
      if (0x4000 < uVar12) {
        return -0x7100;
      }
      mVar4 = pmVar7->mode;
      bVar21 = true;
      if (mVar4 == MBEDTLS_MODE_STREAM) {
LAB_00112c3b:
        if (ssl->minor_ver < 1) goto LAB_00112d60;
        mbedtls_md_hmac_update(&pmVar13->md_ctx_enc,ssl->out_ctr,8);
        mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_hdr,3);
        mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_len,2);
        mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_msg,ssl->out_msglen);
        mbedtls_md_hmac_finish(&ssl->transform_out->md_ctx_enc,mac);
        mbedtls_md_hmac_reset(&ssl->transform_out->md_ctx_enc);
        memcpy(ssl->out_msg + ssl->out_msglen,mac,ssl->transform_out->maclen);
        pmVar13 = ssl->transform_out;
        uVar12 = ssl->out_msglen + pmVar13->maclen;
        ssl->out_msglen = uVar12;
        if (!bVar21) {
          bVar21 = false;
          goto LAB_00112d85;
        }
        mac[0] = '\0';
        mac[1] = '\0';
        mac[2] = '\0';
        mac[3] = '\0';
        mac[4] = '\0';
        mac[5] = '\0';
        mac[6] = '\0';
        mac[7] = '\0';
        iVar9 = mbedtls_cipher_crypt
                          (&pmVar13->cipher_ctx_enc,pmVar13->iv_enc,pmVar13->ivlen,ssl->out_msg,
                           uVar12,ssl->out_msg,(size_t *)mac);
        if (iVar9 != 0) {
          return iVar9;
        }
        sVar20 = ssl->out_msglen;
        if (sVar20 != mac._0_8_) {
          return -0x6c00;
        }
      }
      else {
        if (mVar4 == MBEDTLS_MODE_CBC) {
          bVar21 = true;
          if (ssl->session_out->encrypt_then_mac == 0) {
            bVar21 = false;
            goto LAB_00112c3b;
          }
        }
        else {
LAB_00112d85:
          if (mVar4 != MBEDTLS_MODE_CBC) {
            if ((mVar4 != MBEDTLS_MODE_CCM) && (mVar4 != MBEDTLS_MODE_GCM)) {
              return -0x6c00;
            }
            mac._0_8_ = *(undefined8 *)ssl->out_ctr;
            uVar3 = ssl->minor_ver;
            uVar8 = (uchar)ssl->major_ver;
            uVar17 = 1;
            if (uVar3 != 2) {
              uVar17 = uVar3;
            }
            bVar22 = (ssl->conf->field_0x174 & 2) == 0;
            mac[9] = '\x01' - uVar8;
            if (bVar22) {
              mac[9] = uVar8;
            }
            uVar17 = (uint)(byte)-(char)uVar17;
            if (bVar22) {
              uVar17 = uVar3;
            }
            mac[8] = (uchar)ssl->out_msgtype;
            mac[10] = (uchar)uVar17;
            mac[0xc] = (uchar)uVar12;
            mac[0xb] = (uchar)(uVar12 >> 8);
            if (pmVar13->ivlen - pmVar13->fixed_ivlen != 8) {
              return -0x6c00;
            }
            sVar20 = (ulong)((pmVar13->ciphersuite_info->flags & 2) == 0) * 8 + 8;
            *(undefined8 *)(pmVar13->iv_enc + pmVar13->fixed_ivlen) = mac._0_8_;
            *(undefined8 *)ssl->out_iv = *(undefined8 *)ssl->out_ctr;
            pmVar13 = ssl->transform_out;
            puVar10 = ssl->out_msg;
            sVar16 = ssl->out_msglen;
            iv_len = pmVar13->ivlen;
            ssl->out_msglen = (iv_len + sVar16) - pmVar13->fixed_ivlen;
            iVar9 = mbedtls_cipher_auth_encrypt
                              (&pmVar13->cipher_ctx_enc,pmVar13->iv_enc,iv_len,mac,0xd,puVar10,
                               sVar16,puVar10,&olen_1,puVar10 + sVar16,sVar20);
            if (iVar9 != 0) {
              return iVar9;
            }
            if (olen_1 != sVar16) {
              return -0x6c00;
            }
            sVar20 = sVar20 + ssl->out_msglen;
            ssl->out_msglen = sVar20;
            if (!bVar21) {
              return -0x6c00;
            }
            goto LAB_001130ad;
          }
        }
        olen_1 = 0;
        lVar18 = 0;
        uVar12 = (uVar12 + 1) % pmVar13->ivlen;
        lVar14 = pmVar13->ivlen - uVar12;
        if (uVar12 == 0) {
          lVar14 = 0;
        }
        do {
          ssl->out_msg[lVar18 + ssl->out_msglen] = (uchar)lVar14;
          lVar18 = lVar18 + 1;
        } while (lVar14 + 1 + (ulong)(lVar14 + 1 == 0) != lVar18);
        sVar20 = lVar14 + 1 + ssl->out_msglen;
        ssl->out_msglen = sVar20;
        pmVar13 = ssl->transform_out;
        if (ssl->minor_ver < 2) {
          puVar10 = ssl->out_msg;
          sVar16 = pmVar13->ivlen;
        }
        else {
          iVar9 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar13->iv_enc,pmVar13->ivlen);
          if (iVar9 != 0) {
            return iVar9;
          }
          memcpy(ssl->out_iv,ssl->transform_out->iv_enc,ssl->transform_out->ivlen);
          pmVar13 = ssl->transform_out;
          puVar10 = ssl->out_msg;
          sVar20 = ssl->out_msglen;
          sVar16 = pmVar13->ivlen;
          ssl->out_msglen = sVar16 + sVar20;
        }
        iVar9 = mbedtls_cipher_crypt
                          (&pmVar13->cipher_ctx_enc,pmVar13->iv_enc,sVar16,puVar10,sVar20,puVar10,
                           &olen_1);
        if (iVar9 != 0) {
          return iVar9;
        }
        if (sVar20 != olen_1) {
          return -0x6c00;
        }
        if (ssl->minor_ver < 2) {
          pmVar13 = ssl->transform_out;
          memcpy(pmVar13->iv_enc,(pmVar13->cipher_ctx_enc).iv,pmVar13->ivlen);
        }
        sVar20 = ssl->out_msglen;
        if (bVar21) {
          mac._0_8_ = *(undefined8 *)ssl->out_ctr;
          mac[10] = ssl->out_hdr[2];
          mac._8_2_ = *(undefined2 *)ssl->out_hdr;
          mac._11_2_ = (ushort)sVar20 << 8 | (ushort)sVar20 >> 8;
          mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,mac,0xd);
          mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_iv,ssl->out_msglen);
          mbedtls_md_hmac_finish(&ssl->transform_out->md_ctx_enc,ssl->out_iv + ssl->out_msglen);
          mbedtls_md_hmac_reset(&ssl->transform_out->md_ctx_enc);
          sVar20 = ssl->out_msglen + ssl->transform_out->maclen;
          ssl->out_msglen = sVar20;
        }
      }
LAB_001130ad:
      *ssl->out_len = (uchar)(sVar20 >> 8);
      ssl->out_len[1] = (uchar)sVar20;
    }
    ssl->out_left = ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5;
    iVar9 = mbedtls_ssl_flush_output(ssl);
  }
  return iVar9;
}

Assistant:

int mbedtls_ssl_write_record( mbedtls_ssl_context *ssl )
{
    int ret, done = 0, out_msg_type;
    size_t len = ssl->out_msglen;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write record" ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        ; /* Skip special handshake treatment when resending */
    }
    else
#endif
    if( ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        out_msg_type = ssl->out_msg[0];

        if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST &&
            ssl->handshake == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        ssl->out_msg[1] = (unsigned char)( ( len - 4 ) >> 16 );
        ssl->out_msg[2] = (unsigned char)( ( len - 4 ) >>  8 );
        ssl->out_msg[3] = (unsigned char)( ( len - 4 )       );

        /*
         * DTLS has additional fields in the Handshake layer,
         * between the length field and the actual payload:
         *      uint16 message_seq;
         *      uint24 fragment_offset;
         *      uint24 fragment_length;
         */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        {
            /* Make room for the additional DTLS fields */
            if( MBEDTLS_SSL_MAX_CONTENT_LEN - ssl->out_msglen < 8 )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "DTLS handshake message too large: "
                              "size %u, maximum %u",
                               (unsigned) ( ssl->in_hslen - 4 ),
                               (unsigned) ( MBEDTLS_SSL_MAX_CONTENT_LEN - 12 ) ) );
                return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
            }

            memmove( ssl->out_msg + 12, ssl->out_msg + 4, len - 4 );
            ssl->out_msglen += 8;
            len += 8;

            /* Write message_seq and update it, except for HelloRequest */
            if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST )
            {
                ssl->out_msg[4] = ( ssl->handshake->out_msg_seq >> 8 ) & 0xFF;
                ssl->out_msg[5] = ( ssl->handshake->out_msg_seq      ) & 0xFF;
                ++( ssl->handshake->out_msg_seq );
            }
            else
            {
                ssl->out_msg[4] = 0;
                ssl->out_msg[5] = 0;
            }

            /* We don't fragment, so frag_offset = 0 and frag_len = len */
            memset( ssl->out_msg + 6, 0x00, 3 );
            memcpy( ssl->out_msg + 9, ssl->out_msg + 1, 3 );
        }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST )
            ssl->handshake->update_checksum( ssl, ssl->out_msg, len );
    }

    /* Save handshake and CCS messages for resending */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state != MBEDTLS_SSL_RETRANS_SENDING &&
        ( ssl->out_msgtype == MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC ||
          ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE ) )
    {
        if( ( ret = ssl_flight_append( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_flight_append", ret );
            return( ret );
        }
    }
#endif

#if defined(MBEDTLS_ZLIB_SUPPORT)
    if( ssl->transform_out != NULL &&
        ssl->session_out->compression == MBEDTLS_SSL_COMPRESS_DEFLATE )
    {
        if( ( ret = ssl_compress_buf( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_compress_buf", ret );
            return( ret );
        }

        len = ssl->out_msglen;
    }
#endif /*MBEDTLS_ZLIB_SUPPORT */

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_write != NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_write()" ) );

        ret = mbedtls_ssl_hw_record_write( ssl );
        if( ret != 0 && ret != MBEDTLS_ERR_SSL_HW_ACCEL_FALLTHROUGH )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_write", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }

        if( ret == 0 )
            done = 1;
    }
#endif /* MBEDTLS_SSL_HW_RECORD_ACCEL */
    if( !done )
    {
        ssl->out_hdr[0] = (unsigned char) ssl->out_msgtype;
        mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                           ssl->conf->transport, ssl->out_hdr + 1 );

        ssl->out_len[0] = (unsigned char)( len >> 8 );
        ssl->out_len[1] = (unsigned char)( len      );

        if( ssl->transform_out != NULL )
        {
            if( ( ret = ssl_encrypt_buf( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_encrypt_buf", ret );
                return( ret );
            }

            len = ssl->out_msglen;
            ssl->out_len[0] = (unsigned char)( len >> 8 );
            ssl->out_len[1] = (unsigned char)( len      );
        }

        ssl->out_left = mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen;

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "output record: msgtype = %d, "
                            "version = [%d:%d], msglen = %d",
                       ssl->out_hdr[0], ssl->out_hdr[1], ssl->out_hdr[2],
                     ( ssl->out_len[0] << 8 ) | ssl->out_len[1] ) );

        MBEDTLS_SSL_DEBUG_BUF( 4, "output record sent to network",
                       ssl->out_hdr, mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen );
    }

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_flush_output", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write record" ) );

    return( 0 );
}